

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListEnlarge(sqlite3 *db,SrcList *pSrc,int nExtra,int iStart)

{
  undefined1 auVar1 [16];
  int iVar2;
  int nGot;
  int nAlloc;
  SrcList *pNew;
  int i;
  int iStart_local;
  int nExtra_local;
  SrcList *pSrc_local;
  sqlite3 *db_local;
  
  _iStart_local = pSrc;
  if (pSrc->nAlloc < (uint)(pSrc->nSrc + nExtra)) {
    _iStart_local =
         (SrcList *)sqlite3DbRealloc(db,pSrc,(long)(pSrc->nSrc * 2 + nExtra + -1) * 0x70 + 0x78);
    if (_iStart_local == (SrcList *)0x0) {
      return pSrc;
    }
    iVar2 = sqlite3DbMallocSize(db,_iStart_local);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2 - 0x78;
    _iStart_local->nAlloc = SUB164(auVar1 / ZEXT816(0x70),0) + 1;
  }
  pNew._4_4_ = _iStart_local->nSrc;
  while (pNew._4_4_ = pNew._4_4_ + -1, iStart <= pNew._4_4_) {
    memcpy(_iStart_local->a + (pNew._4_4_ + nExtra),_iStart_local->a + pNew._4_4_,0x70);
  }
  _iStart_local->nSrc = nExtra + _iStart_local->nSrc;
  memset(_iStart_local->a + iStart,0,(long)nExtra * 0x70);
  for (pNew._4_4_ = iStart; pNew._4_4_ < iStart + nExtra; pNew._4_4_ = pNew._4_4_ + 1) {
    _iStart_local->a[pNew._4_4_].iCursor = -1;
  }
  return _iStart_local;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  sqlite3 *db,       /* Database connection to notify of OOM errors */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    int nAlloc = pSrc->nSrc*2+nExtra;
    int nGot;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return pSrc;
    }
    pSrc = pNew;
    nGot = (sqlite3DbMallocSize(db, pNew) - sizeof(*pSrc))/sizeof(pSrc->a[0])+1;
    pSrc->nAlloc = nGot;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}